

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

void __thiscall CVmTimeZoneCache::set_local_zone(CVmTimeZoneCache *this,char *name)

{
  CVmTimeZone *this_00;
  size_t sVar1;
  char *__dest;
  
  if (this->local_zone_name_ != (char *)0x0) {
    operator_delete__(this->local_zone_name_);
  }
  sVar1 = strlen(name);
  __dest = (char *)operator_new__(sVar1 + 1);
  this->local_zone_name_ = __dest;
  memcpy(__dest,name,sVar1 + 1);
  this_00 = this->local_zone_;
  if (this_00 != (CVmTimeZone *)0x0) {
    CVmTimeZone::~CVmTimeZone(this_00);
    operator_delete(this_00,0x68);
    this->local_zone_ = (CVmTimeZone *)0x0;
  }
  return;
}

Assistant:

void CVmTimeZoneCache::set_local_zone(const char *name)
{
    /* delete any existing name */
    if (local_zone_name_ != 0)
        delete [] local_zone_name_;

    /* save a copy of the new name */
    size_t len = strlen(name) + 1;
    local_zone_name_ = new char[len];
    memcpy(local_zone_name_, name, len);

    /* if we've previously loaded a local zone, delete it */
    if (local_zone_ != 0)
    {
        delete local_zone_;
        local_zone_ = 0;
    }
}